

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrum_sf2.cpp
# Opt level: O0

void __thiscall SFFile::~SFFile(SFFile *this)

{
  float *pfVar1;
  int local_14;
  int i;
  SFFile *this_local;
  
  (this->super_FontFile)._vptr_FontFile = (_func_int **)&PTR__SFFile_00b64a08;
  if ((this->Presets != (SFPreset *)0x0) && (this->Presets != (SFPreset *)0x0)) {
    operator_delete__(this->Presets);
  }
  if ((this->PresetBags != (SFBag *)0x0) && (this->PresetBags != (SFBag *)0x0)) {
    operator_delete__(this->PresetBags);
  }
  if ((this->PresetGenerators != (SFGenList *)0x0) && (this->PresetGenerators != (SFGenList *)0x0))
  {
    operator_delete__(this->PresetGenerators);
  }
  if ((this->Instruments != (SFInst *)0x0) && (this->Instruments != (SFInst *)0x0)) {
    operator_delete__(this->Instruments);
  }
  if ((this->InstrBags != (SFBag *)0x0) && (this->InstrBags != (SFBag *)0x0)) {
    operator_delete__(this->InstrBags);
  }
  if ((this->InstrGenerators != (SFGenList *)0x0) && (this->InstrGenerators != (SFGenList *)0x0)) {
    operator_delete__(this->InstrGenerators);
  }
  if (this->Samples != (SFSample *)0x0) {
    for (local_14 = 0; local_14 < this->NumSamples; local_14 = local_14 + 1) {
      if ((this->Samples[local_14].InMemoryData != (float *)0x0) &&
         (pfVar1 = this->Samples[local_14].InMemoryData, pfVar1 != (float *)0x0)) {
        operator_delete__(pfVar1);
      }
    }
    if (this->Samples != (SFSample *)0x0) {
      operator_delete__(this->Samples);
    }
  }
  TArray<SFPerc,_SFPerc>::~TArray(&this->Percussion);
  Timidity::FontFile::~FontFile(&this->super_FontFile);
  return;
}

Assistant:

SFFile::~SFFile()
{
	if (Presets != NULL)
	{
		delete[] Presets;
	}
	if (PresetBags != NULL)
	{
		delete[] PresetBags;
	}
	if (PresetGenerators != NULL)
	{
		delete[] PresetGenerators;
	}
	if (Instruments != NULL)
	{
		delete[] Instruments;
	}
	if (InstrBags != NULL)
	{
		delete[] InstrBags;
	}
	if (InstrGenerators != NULL)
	{
		delete[] InstrGenerators;
	}
	if (Samples != NULL)
	{
		for (int i = 0; i < NumSamples; ++i)
		{
			if (Samples[i].InMemoryData != NULL)
			{
				delete[] Samples[i].InMemoryData;
			}
		}
		delete[] Samples;
	}
}